

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_propertyIsEnumerable(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSAtom prop;
  int iVar1;
  JSValueUnion p;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  JSPropertyDescriptor desc;
  
  JVar4 = JS_ToObject(ctx,this_val);
  p = JVar4.u;
  iVar3 = 6;
  if ((uint)JVar4.tag == 6) {
LAB_0010e859:
    prop = 0;
  }
  else {
    prop = JS_ValueToAtom(ctx,*argv);
    if (prop == 0) goto LAB_0010e859;
    iVar1 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)p.ptr,prop);
    if (-1 < iVar1) {
      iVar3 = 1;
      if (iVar1 != 0) {
        js_free_desc(ctx,&desc);
        JVar2._0_4_ = (uint)desc.flags >> 2 & 1;
        JVar2._4_4_ = 0;
        goto LAB_0010e8ac;
      }
    }
  }
  JVar2.float64 = 0.0;
LAB_0010e8ac:
  JS_FreeAtom(ctx,prop);
  if ((0xfffffff4 < (uint)JVar4.tag) && (iVar1 = *p.ptr, *(int *)p.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar4);
  }
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue js_object_propertyIsEnumerable(JSContext *ctx, JSValueConst this_val,
                                              int argc, JSValueConst *argv)
{
    JSValue obj, res = JS_EXCEPTION;
    JSAtom prop = JS_ATOM_NULL;
    JSPropertyDescriptor desc;
    int has_prop;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;
    prop = JS_ValueToAtom(ctx, argv[0]);
    if (unlikely(prop == JS_ATOM_NULL))
        goto exception;

    has_prop = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), prop);
    if (has_prop < 0)
        goto exception;
    if (has_prop) {
        res = JS_NewBool(ctx, (desc.flags & JS_PROP_ENUMERABLE) != 0);
        js_free_desc(ctx, &desc);
    } else {
        res = JS_FALSE;
    }

exception:
    JS_FreeAtom(ctx, prop);
    JS_FreeValue(ctx, obj);
    return res;
}